

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void zeroblobFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3 *psVar1;
  int iVar2;
  i64 iVar3;
  
  psVar1 = (context->s).db;
  iVar3 = sqlite3VdbeIntValue(*argv);
  if (psVar1->aLimit[0] < iVar3) {
    context->isError = 0x12;
    sqlite3VdbeMemSetStr(&context->s,"string or blob too big",-1,'\x01',(_func_void_void_ptr *)0x0);
    return;
  }
  sqlite3VdbeMemRelease(&context->s);
  (context->s).n = 0;
  (context->s).flags = 0x4010;
  (context->s).type = '\x04';
  (context->s).enc = '\x01';
  iVar2 = 0;
  if (0 < (int)iVar3) {
    iVar2 = (int)iVar3;
  }
  (context->s).u.nZero = iVar2;
  return;
}

Assistant:

static void zeroblobFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  i64 n;
  sqlite3 *db = sqlite3_context_db_handle(context);
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  n = sqlite3_value_int64(argv[0]);
  testcase( n==db->aLimit[SQLITE_LIMIT_LENGTH] );
  testcase( n==db->aLimit[SQLITE_LIMIT_LENGTH]+1 );
  if( n>db->aLimit[SQLITE_LIMIT_LENGTH] ){
    sqlite3_result_error_toobig(context);
  }else{
    sqlite3_result_zeroblob(context, (int)n); /* IMP: R-00293-64994 */
  }
}